

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

_Bool ExportAutomationEventList(AutomationEventList list,char *fileName)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  char *text;
  AutomationEvent *pAVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  pAVar4 = list.events;
  uVar6 = list._0_8_ >> 0x20;
  text = (char *)calloc((ulong)(list.count * 0x100 + 0x800),1);
  text[0] = '#';
  text[1] = '\n';
  memcpy(text + 2,"# Automation events exporter v1.0 - raylib automation events list\n",0x42);
  text[0x44] = '#';
  text[0x45] = '\n';
  text[0x54] = '_';
  text[0x55] = 'c';
  text[0x56] = 'o';
  text[0x57] = 'u';
  text[0x58] = 'n';
  text[0x59] = 't';
  text[0x5a] = '>';
  text[0x5b] = '\n';
  text[0x46] = '#';
  text[0x47] = ' ';
  text[0x48] = ' ';
  text[0x49] = ' ';
  text[0x4a] = ' ';
  text[0x4b] = 'c';
  text[0x4c] = ' ';
  text[0x4d] = '<';
  text[0x4e] = 'e';
  text[0x4f] = 'v';
  text[0x50] = 'e';
  text[0x51] = 'n';
  text[0x52] = 't';
  text[0x53] = 's';
  text[0x54] = '_';
  text[0x55] = 'c';
  memcpy(text + 0x5c,
         "#    e <frame> <event_type> <param0> <param1> <param2> <param3> // <event_type_name>\n",
         0x55);
  text[0xb1] = '#';
  text[0xb2] = '\n';
  text[0xe3] = '/';
  text[0xe4] = 'r';
  text[0xe5] = 'a';
  text[0xe6] = 'y';
  text[0xe7] = 'l';
  text[0xe8] = 'i';
  text[0xe9] = 'b';
  text[0xea] = '\n';
  text[0xb3] = '#';
  text[0xb4] = ' ';
  text[0xb5] = 'm';
  text[0xb6] = 'o';
  text[0xb7] = 'r';
  text[0xb8] = 'e';
  text[0xb9] = ' ';
  text[0xba] = 'i';
  text[0xbb] = 'n';
  text[0xbc] = 'f';
  text[0xbd] = 'o';
  text[0xbe] = ' ';
  text[0xbf] = 'a';
  text[0xc0] = 'n';
  text[0xc1] = 'd';
  text[0xc2] = ' ';
  text[0xc3] = 'b';
  text[0xc4] = 'u';
  text[0xc5] = 'g';
  text[0xc6] = 's';
  text[199] = '-';
  text[200] = 'r';
  text[0xc9] = 'e';
  text[0xca] = 'p';
  text[0xcb] = 'o';
  text[0xcc] = 'r';
  text[0xcd] = 't';
  text[0xce] = ':';
  text[0xcf] = ' ';
  text[0xd0] = ' ';
  text[0xd1] = 'g';
  text[0xd2] = 'i';
  text[0xd3] = 't';
  text[0xd4] = 'h';
  text[0xd5] = 'u';
  text[0xd6] = 'b';
  text[0xd7] = '.';
  text[0xd8] = 'c';
  text[0xd9] = 'o';
  text[0xda] = 'm';
  text[0xdb] = '/';
  text[0xdc] = 'r';
  text[0xdd] = 'a';
  text[0xde] = 'y';
  text[0xdf] = 's';
  text[0xe0] = 'a';
  text[0xe1] = 'n';
  text[0xe2] = '5';
  text[0xeb] = '#';
  text[0xec] = ' ';
  text[0xed] = 'f';
  text[0xee] = 'e';
  text[0xef] = 'e';
  text[0xf0] = 'd';
  text[0xf1] = 'b';
  text[0xf2] = 'a';
  text[0xf3] = 'c';
  text[0xf4] = 'k';
  text[0xf5] = ' ';
  text[0xf6] = 'a';
  text[0xf7] = 'n';
  text[0xf8] = 'd';
  text[0xf9] = ' ';
  text[0xfa] = 's';
  text[0xfb] = 'u';
  text[0xfc] = 'p';
  text[0xfd] = 'p';
  text[0xfe] = 'o';
  text[0xff] = 'r';
  text[0x100] = 't';
  text[0x101] = ':';
  text[0x102] = ' ';
  text[0x103] = ' ';
  text[0x104] = ' ';
  text[0x105] = ' ';
  text[0x106] = ' ';
  text[0x107] = ' ';
  text[0x108] = ' ';
  text[0x109] = 'r';
  text[0x10a] = 'a';
  text[0x10b] = 'y';
  text[0x10c] = '[';
  text[0x10d] = 'a';
  text[0x10e] = 't';
  text[0x10f] = ']';
  text[0x110] = 'r';
  text[0x111] = 'a';
  text[0x112] = 'y';
  text[0x113] = 'l';
  text[0x114] = 'i';
  text[0x115] = 'b';
  text[0x116] = '.';
  text[0x117] = 'c';
  text[0x118] = 'o';
  text[0x119] = 'm';
  text[0x11a] = '\n';
  text[0x11b] = '#';
  text[0x11c] = '\n';
  text[0x14b] = 'a';
  text[0x14c] = 'y';
  text[0x14d] = 's';
  text[0x14e] = 'a';
  text[0x14f] = 'n';
  text[0x150] = '5';
  text[0x151] = ')';
  text[0x152] = '\n';
  text[0x11d] = '#';
  text[0x11e] = ' ';
  text[0x11f] = 'C';
  text[0x120] = 'o';
  text[0x121] = 'p';
  text[0x122] = 'y';
  text[0x123] = 'r';
  text[0x124] = 'i';
  text[0x125] = 'g';
  text[0x126] = 'h';
  text[0x127] = 't';
  text[0x128] = ' ';
  text[0x129] = '(';
  text[0x12a] = 'c';
  text[299] = ')';
  text[300] = ' ';
  text[0x12d] = '2';
  text[0x12e] = '0';
  text[0x12f] = '2';
  text[0x130] = '3';
  text[0x131] = '-';
  text[0x132] = '2';
  text[0x133] = '0';
  text[0x134] = '2';
  text[0x135] = '4';
  text[0x136] = ' ';
  text[0x137] = 'R';
  text[0x138] = 'a';
  text[0x139] = 'm';
  text[0x13a] = 'o';
  text[0x13b] = 'n';
  text[0x13c] = ' ';
  text[0x13d] = 'S';
  text[0x13e] = 'a';
  text[0x13f] = 'n';
  text[0x140] = 't';
  text[0x141] = 'a';
  text[0x142] = 'm';
  text[0x143] = 'a';
  text[0x144] = 'r';
  text[0x145] = 'i';
  text[0x146] = 'a';
  text[0x147] = ' ';
  text[0x148] = '(';
  text[0x149] = '@';
  text[0x14a] = 'r';
  text[0x14b] = 'a';
  text[0x14c] = 'y';
  text[0x153] = '#';
  text[0x154] = '\n';
  text[0x155] = '\n';
  text[0x156] = '\0';
  iVar2 = sprintf(text + 0x156,"c %i\n",uVar6);
  iVar2 = iVar2 + 0x156;
  for (lVar7 = 0; uVar6 * 0x18 - lVar7 != 0; lVar7 = lVar7 + 0x18) {
    uVar5 = (ulong)*(uint *)((long)pAVar4->params + lVar7 + -4);
    iVar3 = snprintf(text + iVar2,0x100,"e %i %i %i %i %i %i // Event: %s\n",
                     (ulong)*(uint *)((long)pAVar4->params + lVar7 + -8),uVar5,
                     (ulong)*(uint *)((long)pAVar4->params + lVar7),
                     (ulong)*(uint *)((long)pAVar4->params + lVar7 + 4),
                     (ulong)*(uint *)((long)pAVar4->params + lVar7 + 8),
                     (ulong)*(uint *)((long)pAVar4->params + lVar7 + 0xc),
                     autoEventTypeName_rel + *(int *)(autoEventTypeName_rel + uVar5 * 4));
    iVar2 = iVar2 + iVar3;
  }
  _Var1 = SaveFileText(fileName,text);
  free(text);
  return _Var1;
}

Assistant:

bool ExportAutomationEventList(AutomationEventList list, const char *fileName)
{
    bool success = false;

#if defined(SUPPORT_AUTOMATION_EVENTS)
    // Export events as binary file
    // TODO: Save to memory buffer and SaveFileData()
    /*
    unsigned char fileId[4] = "rAE ";
    FILE *raeFile = fopen(fileName, "wb");
    fwrite(fileId, sizeof(unsigned char), 4, raeFile);
    fwrite(&eventCount, sizeof(int), 1, raeFile);
    fwrite(events, sizeof(AutomationEvent), eventCount, raeFile);
    fclose(raeFile);
    */

    // Export events as text
    // TODO: Save to memory buffer and SaveFileText()
    char *txtData = (char *)RL_CALLOC(256*list.count + 2048, sizeof(char)); // 256 characters per line plus some header

    int byteCount = 0;
    byteCount += sprintf(txtData + byteCount, "#\n");
    byteCount += sprintf(txtData + byteCount, "# Automation events exporter v1.0 - raylib automation events list\n");
    byteCount += sprintf(txtData + byteCount, "#\n");
    byteCount += sprintf(txtData + byteCount, "#    c <events_count>\n");
    byteCount += sprintf(txtData + byteCount, "#    e <frame> <event_type> <param0> <param1> <param2> <param3> // <event_type_name>\n");
    byteCount += sprintf(txtData + byteCount, "#\n");
    byteCount += sprintf(txtData + byteCount, "# more info and bugs-report:  github.com/raysan5/raylib\n");
    byteCount += sprintf(txtData + byteCount, "# feedback and support:       ray[at]raylib.com\n");
    byteCount += sprintf(txtData + byteCount, "#\n");
    byteCount += sprintf(txtData + byteCount, "# Copyright (c) 2023-2024 Ramon Santamaria (@raysan5)\n");
    byteCount += sprintf(txtData + byteCount, "#\n\n");

    // Add events data
    byteCount += sprintf(txtData + byteCount, "c %i\n", list.count);
    for (unsigned int i = 0; i < list.count; i++)
    {
        byteCount += snprintf(txtData + byteCount, 256, "e %i %i %i %i %i %i // Event: %s\n", list.events[i].frame, list.events[i].type,
            list.events[i].params[0], list.events[i].params[1], list.events[i].params[2], list.events[i].params[3], autoEventTypeName[list.events[i].type]);
    }

    // NOTE: Text data size exported is determined by '\0' (NULL) character
    success = SaveFileText(fileName, txtData);

    RL_FREE(txtData);
#endif

    return success;
}